

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void sort_areas(void)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  bool bVar7;
  
  bVar7 = true;
  plVar6 = (long *)&area_first;
  do {
    while ((plVar6 = (long *)*plVar6, plVar6 != (long *)0x0 &&
           (plVar1 = (long *)*plVar6, plVar1 != (long *)0x0))) {
      if ((short)plVar1[0xb] < (short)plVar6[0xb]) {
        lVar2 = *plVar1;
        if (lVar2 != 0) {
          *(long **)(lVar2 + 8) = plVar6;
        }
        puVar3 = (undefined8 *)plVar6[1];
        bVar7 = plVar6 == _area_first;
        plVar1[1] = (long)puVar3;
        if (bVar7) {
          plVar6[1] = (long)plVar1;
          *plVar1 = (long)plVar6;
          *plVar6 = lVar2;
          bVar7 = false;
          _area_first = plVar1;
        }
        else {
          *puVar3 = plVar1;
          plVar1 = (long *)*plVar6;
          plVar6[1] = (long)plVar1;
          lVar2 = *plVar1;
          *plVar1 = (long)plVar6;
          *plVar6 = lVar2;
          bVar7 = false;
        }
      }
    }
    plVar6 = (long *)&area_first;
    bVar4 = !bVar7;
    bVar7 = true;
  } while (bVar4);
  if (_area_first != (long *)0x0) {
    iVar5 = 0;
    plVar6 = _area_first;
    do {
      *(int *)(plVar6 + 0x2d) = iVar5;
      iVar5 = iVar5 + 1;
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  return;
}

Assistant:

void sort_areas(void)
{
	AREA_DATA *placeholder;
	AREA_DATA *pArea;
	bool sorted= false;
	bool first= false;
	int vnum = 0;

	while (!sorted)
	{
		sorted = true;

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			first= false;

			if (!pArea->next)
				break;

			if (pArea == area_first)
				first = true;

			if (pArea->min_vnum > pArea->next->min_vnum)
			{
				sorted= false;

				if (pArea->next->next)
					pArea->next->next->prev = pArea;

				pArea->next->prev = pArea->prev;

				if (!first)
					pArea->prev->next = pArea->next;

				pArea->prev = pArea->next;
				placeholder = pArea->next->next;
				pArea->next->next = pArea;
				pArea->next = placeholder;

				if (first)
					area_first = pArea->prev;
			}
		}
	}

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		pArea->vnum = vnum;
		vnum++;
	}
}